

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O0

int chacha20poly1305_setup_crypto
              (ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv,
              ptls_cipher_algorithm_t *chacha,
              _func_void_chacha20poly1305_context_t_ptr_void_ptr *poly1305_init,
              _func_void_chacha20poly1305_context_t_ptr_void_ptr_size_t *poly1305_update,
              _func_void_chacha20poly1305_context_t_ptr_void_ptr *poly1305_finish)

{
  st_ptls_aead_algorithm_t *psVar1;
  chacha20poly1305_context_t *ctx;
  _func_void_chacha20poly1305_context_t_ptr_void_ptr *poly1305_init_local;
  ptls_cipher_algorithm_t *chacha_local;
  void *iv_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *_ctx_local;
  
  _ctx->dispose_crypto = chacha20poly1305_dispose_crypto;
  _ctx->do_get_iv = chacha20poly1305_get_iv;
  _ctx->do_set_iv = chacha20poly1305_set_iv;
  if (is_enc == 0) {
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    _ctx->do_encrypt =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
          *)0x0;
    _ctx->do_encrypt_v =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
    _ctx->do_decrypt = chacha20poly1305_decrypt;
  }
  else {
    _ctx->do_encrypt_init = chacha20poly1305_init;
    _ctx->do_encrypt_update = chacha20poly1305_encrypt_update;
    _ctx->do_encrypt_final = chacha20poly1305_encrypt_final;
    _ctx->do_encrypt = ptls_aead__do_encrypt;
    _ctx->do_encrypt_v = ptls_aead__do_encrypt_v;
    _ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
  }
  psVar1 = (st_ptls_aead_algorithm_t *)ptls_cipher_new(chacha,is_enc,key);
  _ctx[1].algo = psVar1;
  if (psVar1 == (st_ptls_aead_algorithm_t *)0x0) {
    _ctx_local._4_4_ = 0x203;
  }
  else {
    _ctx[1].dispose_crypto = *iv;
    *(undefined4 *)&_ctx[1].do_get_iv = *(undefined4 *)((long)iv + 8);
    _ctx[1].do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)poly1305_init;
    _ctx[1].do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)poly1305_update;
    _ctx[1].do_encrypt =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
          *)poly1305_finish;
    _ctx_local._4_4_ = 0;
  }
  return _ctx_local._4_4_;
}

Assistant:

static int chacha20poly1305_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv,
                                         ptls_cipher_algorithm_t *chacha,
                                         void (*poly1305_init)(struct chacha20poly1305_context_t *, const void *),
                                         void (*poly1305_update)(struct chacha20poly1305_context_t *, const void *, size_t),
                                         void (*poly1305_finish)(struct chacha20poly1305_context_t *, void *))
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;

    ctx->super.dispose_crypto = chacha20poly1305_dispose_crypto;
    ctx->super.do_get_iv = chacha20poly1305_get_iv;
    ctx->super.do_set_iv = chacha20poly1305_set_iv;
    if (is_enc) {
        ctx->super.do_encrypt_init = chacha20poly1305_init;
        ctx->super.do_encrypt_update = chacha20poly1305_encrypt_update;
        ctx->super.do_encrypt_final = chacha20poly1305_encrypt_final;
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_encrypt_v = ptls_aead__do_encrypt_v;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_encrypt = NULL;
        ctx->super.do_encrypt_v = NULL;
        ctx->super.do_decrypt = chacha20poly1305_decrypt;
    }

    if ((ctx->chacha = ptls_cipher_new(chacha, is_enc, key)) == NULL)
        return PTLS_ERROR_LIBRARY;

    memcpy(ctx->static_iv, iv, sizeof(ctx->static_iv));
    ctx->poly1305_init = poly1305_init;
    ctx->poly1305_update = poly1305_update;
    ctx->poly1305_finish = poly1305_finish;

    return 0;
}